

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O0

void __thiscall
ProjectionLight_Power_Test::~ProjectionLight_Power_Test(ProjectionLight_Power_Test *this)

{
  void *in_RDI;
  
  ~ProjectionLight_Power_Test((ProjectionLight_Power_Test *)0x522258);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(ProjectionLight, Power) {
    SampledWavelengths lambda = SampledWavelengths::SampleUniform(0.5);
    for (Point2i res : {Point2i(512, 256), Point2i(300, 900)}) {
        Image image = MakeLightImage(res);

        ProjectionLight light(Transform(), MediumInterface(), std::move(image),
                              RGBColorSpace::sRGB, 10 /* scale */, 30 /* fov */,
                              -1 /* power */, Allocator());

        SampledSpectrum phi = light.Phi(lambda);

        int nSamples = 1024 * 1024;
        double phiSampled = 0;
        for (Point2f u : Hammersley2D(nSamples)) {
            Vector3f w = SampleUniformSphere(u);
            phiSampled += light.Projection(w, lambda)[0];
        }
        phiSampled /= (nSamples * UniformSpherePDF());

        EXPECT_LT(std::abs(phiSampled - phi[0]), 1e-3)
            << "res: " << res << " qmc: " << phiSampled << ", closed-form: " << phi[0];
    }
}